

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O0

int InsertionSort(EdgeTableEntry *AET)

{
  _EdgeTableEntry *p_Var1;
  _EdgeTableEntry *p_Var2;
  int changed;
  EdgeTableEntry *pETEchaseBackTMP;
  EdgeTableEntry *pETEinsert;
  EdgeTableEntry *pETEchase;
  EdgeTableEntry *AET_local;
  
  changed = 0;
  p_Var1 = AET->next;
  while (AET_local = p_Var1, AET_local != (EdgeTableEntry *)0x0) {
    pETEchase = AET_local;
    while ((AET_local->bres).minor_axis < (pETEchase->back->bres).minor_axis) {
      pETEchase = pETEchase->back;
    }
    p_Var1 = AET_local->next;
    if (pETEchase != AET_local) {
      p_Var2 = pETEchase->back;
      AET_local->back->next = p_Var1;
      if (p_Var1 != (_EdgeTableEntry *)0x0) {
        p_Var1->back = AET_local->back;
      }
      AET_local->next = pETEchase;
      pETEchase->back->next = AET_local;
      pETEchase->back = AET_local;
      AET_local->back = p_Var2;
      changed = 1;
    }
  }
  return changed;
}

Assistant:

static int InsertionSort(EdgeTableEntry *AET)
{
    EdgeTableEntry *pETEchase;
    EdgeTableEntry *pETEinsert;
    EdgeTableEntry *pETEchaseBackTMP;
    int changed = 0;

    AET = AET->next;
    while (AET) {
        pETEinsert = AET;
        pETEchase = AET;
        while (pETEchase->back->bres.minor_axis > AET->bres.minor_axis)
            pETEchase = pETEchase->back;

        AET = AET->next;
        if (pETEchase != pETEinsert) {
            pETEchaseBackTMP = pETEchase->back;
            pETEinsert->back->next = AET;
            if (AET)
                AET->back = pETEinsert->back;
            pETEinsert->next = pETEchase;
            pETEchase->back->next = pETEinsert;
            pETEchase->back = pETEinsert;
            pETEinsert->back = pETEchaseBackTMP;
            changed = 1;
        }
    }
    return changed;
}